

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kurtosis.cpp
# Opt level: O2

void duckdb::KurtosisOperation<duckdb::KurtosisFlagNoBiasCorrection>::
     Finalize<double,duckdb::KurtosisState>
               (KurtosisState *state,double *target,AggregateFinalizeData *finalize_data)

{
  ulong uVar1;
  bool bVar2;
  OutOfRangeException *this;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  allocator local_89;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  string local_40;
  
  uVar1 = state->n;
  if (1 < uVar1) {
    auVar4._8_4_ = (int)(uVar1 >> 0x20);
    auVar4._0_8_ = uVar1;
    auVar4._12_4_ = 0x45300000;
    dVar7 = 1.0 / ((auVar4._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
    dVar3 = state->sum;
    dVar5 = state->sum_sqr;
    dVar8 = dVar3 * dVar3;
    dVar6 = dVar5 - dVar8 * dVar7;
    if ((dVar6 != 0.0) || (NAN(dVar6))) {
      dVar6 = dVar5 - dVar8 * dVar7;
      local_58 = dVar8;
      local_50 = dVar5;
      local_48 = dVar7;
      if ((dVar6 != 0.0) || (NAN(dVar6))) {
        local_78 = state->sum_cub;
        local_80 = state->sum_four;
        local_88 = dVar7;
        local_68 = dVar3;
        local_60 = dVar5;
        local_70 = pow(dVar3,4.0);
        dVar3 = pow(local_88,3.0);
        dVar5 = (state->sum_sqr - state->sum * state->sum * local_88) * local_88;
        if (0.0 < dVar5) {
          dVar3 = ((local_70 * -3.0 * dVar3 +
                   local_60 * 6.0 * local_68 * local_68 * local_88 * local_88 +
                   local_78 * -4.0 * local_68 * local_88 + local_80) * local_88) / (dVar5 * dVar5) +
                  -3.0;
          *target = dVar3;
          bVar2 = Value::DoubleIsFinite(dVar3);
          if (bVar2) {
            return;
          }
          this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string((string *)&local_40,"Kurtosis is out of range!",&local_89);
          OutOfRangeException::OutOfRangeException(this,&local_40);
          __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
    }
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, TARGET_TYPE &target, AggregateFinalizeData &finalize_data) {
		auto n = (double)state.n;
		if (n <= 1) {
			finalize_data.ReturnNull();
			return;
		}
		if (std::is_same<KURTOSIS_FLAG, KurtosisFlagBiasCorrection>::value && n <= 3) {
			finalize_data.ReturnNull();
			return;
		}
		double temp = 1 / n;
		//! This is necessary due to linux 32 bits
		long double temp_aux = 1 / n;
		if (state.sum_sqr - state.sum * state.sum * temp == 0 ||
		    state.sum_sqr - state.sum * state.sum * temp_aux == 0) {
			finalize_data.ReturnNull();
			return;
		}
		double m4 =
		    temp * (state.sum_four - 4 * state.sum_cub * state.sum * temp +
		            6 * state.sum_sqr * state.sum * state.sum * temp * temp - 3 * pow(state.sum, 4) * pow(temp, 3));

		double m2 = temp * (state.sum_sqr - state.sum * state.sum * temp);
		if (m2 <= 0) { // m2 shouldn't be below 0 but floating points are weird
			finalize_data.ReturnNull();
			return;
		}
		if (std::is_same<KURTOSIS_FLAG, KurtosisFlagNoBiasCorrection>::value) {
			target = m4 / (m2 * m2) - 3;
		} else {
			target = (n - 1) * ((n + 1) * m4 / (m2 * m2) - 3 * (n - 1)) / ((n - 2) * (n - 3));
		}
		if (!Value::DoubleIsFinite(target)) {
			throw OutOfRangeException("Kurtosis is out of range!");
		}
	}